

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void dumpU32(uint32_t value,bool inArray)

{
  int i;
  int iVar1;
  
  iVar1 = 0x18;
  do {
    printf("%02hhx ",(ulong)(value >> ((byte)iVar1 & 0x1f) & 0xff));
    iVar1 = iVar1 + -8;
  } while (iVar1 != -8);
  printf("            ");
  if (inArray) {
    putchar(0x20);
    return;
  }
  return;
}

Assistant:

void dumpU32(uint32_t value, bool inArray = false)
{
	for (int i = 24; i >= 0; i -= 8)
	{
		uint8_t v;
		v = (value >> i) & 0xff;
		printf("%02hhx ", v);
	}
	printf("            ");
	if (inArray)
	{
		printf(" ");
	}
}